

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

JavascriptString *
Js::JavascriptNumber::ToLocaleStringIntl
          (ArgumentReader *args,CallInfo callInfo,ScriptContext *scriptContext)

{
  Type TVar1;
  EngineInterfaceObject *this;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  EngineExtensionObjectBase *pEVar8;
  Var pvVar9;
  JavascriptString *pJVar10;
  RecyclableObject *pRVar11;
  char *message;
  char *error;
  ThreadContext *pTVar12;
  uint lineNumber;
  char *fileName;
  Arguments local_68;
  Arguments local_58;
  Type local_48;
  Type local_40;
  double local_38;
  double value;
  Var result;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x305,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00cdc266;
    *puVar7 = 0;
  }
  if (((DAT_015991f0 == '\x01') && (bVar4 = ScriptContext::IsIntlEnabled(scriptContext), bVar4)) &&
     (this = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).engineInterfaceObject.ptr,
     this != (EngineInterfaceObject *)0x0)) {
    pEVar8 = EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
    pSVar2 = pEVar8[1].scriptContext.ptr;
    if (pSVar2 != (ScriptContext *)0x0) {
      pTVar12 = scriptContext->threadContext;
      bVar4 = pTVar12->reentrancySafeOrHandled;
      pTVar12->reentrancySafeOrHandled = true;
      local_68.Info = (args->super_Arguments).Info;
      local_68.Values = (args->super_Arguments).Values;
      pvVar9 = JavascriptFunction::CallFunction((JavascriptFunction *)pSVar2,&local_68);
      pJVar10 = VarTo<Js::JavascriptString>(pvVar9);
LAB_00cdbfe9:
      pTVar12->reentrancySafeOrHandled = bVar4;
      return pJVar10;
    }
    JavascriptLibrary::InitializeIntlForNumberPrototype
              ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    pSVar2 = pEVar8[1].scriptContext.ptr;
    if (pSVar2 != (ScriptContext *)0x0) {
      pTVar12 = scriptContext->threadContext;
      bVar4 = pTVar12->reentrancySafeOrHandled;
      pTVar12->reentrancySafeOrHandled = true;
      local_58.Info = (args->super_Arguments).Info;
      local_58.Values = (args->super_Arguments).Values;
      pvVar9 = JavascriptFunction::CallFunction((JavascriptFunction *)pSVar2,&local_58);
      pJVar10 = VarTo<Js::JavascriptString>(pvVar9);
      goto LAB_00cdbfe9;
    }
  }
  pvVar9 = Arguments::operator[](&args->super_Arguments,0);
  BVar5 = GetThisValue(pvVar9,&local_38);
  if (BVar5 != 0) {
    pJVar10 = ToLocaleString(local_38,scriptContext);
    return pJVar10;
  }
  pvVar9 = Arguments::operator[](&args->super_Arguments,0);
  if (pvVar9 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cdc266;
    *puVar7 = 0;
LAB_00cdc0da:
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00cdc266;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar11->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar9 = Arguments::operator[](&args->super_Arguments,0);
        pRVar11 = VarTo<Js::RecyclableObject>(pvVar9);
        local_48 = (args->super_Arguments).Info;
        local_40 = (args->super_Arguments).Values;
        iVar6 = (*(pRVar11->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar11,EntryToLocaleString,&local_48,&value);
        if (iVar6 != 0) {
          pJVar10 = VarTo<Js::JavascriptString>((Var)value);
          return pJVar10;
        }
      }
      goto LAB_00cdc252;
    }
    BVar5 = RecyclableObject::IsExternal(pRVar11);
    if (BVar5 != 0) goto LAB_00cdc252;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if (((ulong)pvVar9 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar9 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar9 >> 0x32 != 0) || (((ulong)pvVar9 & 0xffff000000000000) == 0x1000000000000))
      goto LAB_00cdc252;
      goto LAB_00cdc0da;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar4 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar4) {
LAB_00cdc266:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar7 = 0;
LAB_00cdc252:
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3c,L"Number.prototype.toLocaleString");
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleStringIntl(ArgumentReader& args, CallInfo callInfo, ScriptContext* scriptContext)
    {
       Assert(scriptContext);
#ifdef ENABLE_INTL_OBJECT
        if(CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled()){

            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* intlExtensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));
                JavascriptFunction* func = intlExtensionObject->GetNumberToLocaleString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return VarTo<JavascriptString>(func->CallFunction(args));
                    }
                    END_SAFE_REENTRANT_CALL
                }
                // Initialize Number.prototype.toLocaleString
                scriptContext->GetLibrary()->InitializeIntlForNumberPrototype();
                func = intlExtensionObject->GetNumberToLocaleString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return VarTo<JavascriptString>(func->CallFunction(args));
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToLocaleString, args, &result))
                {
                    return VarTo<JavascriptString>(result);
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toLocaleString"));
        }

        return JavascriptNumber::ToLocaleString(value, scriptContext);
    }